

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

Expression * __thiscall
soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,ArrayElementRef *s)

{
  bool bVar1;
  ArrayElementRef *s_local;
  RewritingASTVisitor *this_local;
  
  replaceExpression(this,&s->object);
  bVar1 = pool_ptr<soul::AST::Expression>::operator!=(&s->startIndex,(void *)0x0);
  if (bVar1) {
    replaceExpression(this,&s->startIndex);
  }
  bVar1 = pool_ptr<soul::AST::Expression>::operator!=(&s->endIndex,(void *)0x0);
  if (bVar1) {
    replaceExpression(this,&s->endIndex);
  }
  return &s->super_Expression;
}

Assistant:

virtual AST::Expression& visit (AST::ArrayElementRef& s)
    {
        replaceExpression (s.object);
        if (s.startIndex != nullptr)  replaceExpression (s.startIndex);
        if (s.endIndex != nullptr)    replaceExpression (s.endIndex);
        return s;
    }